

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O0

double __thiscall icu_63::Calendar::getTimeInMillis(Calendar *this,UErrorCode *status)

{
  UBool UVar1;
  UErrorCode *status_local;
  Calendar *this_local;
  
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    if (this->fIsTimeSet == '\0') {
      updateTime(this,status);
    }
    UVar1 = ::U_FAILURE(*status);
    if (UVar1 == '\0') {
      this_local = (Calendar *)this->fTime;
    }
    else {
      this_local = (Calendar *)0x0;
    }
  }
  else {
    this_local = (Calendar *)0x0;
  }
  return (double)this_local;
}

Assistant:

double
Calendar::getTimeInMillis(UErrorCode& status) const
{
    if(U_FAILURE(status))
        return 0.0;

    if ( ! fIsTimeSet)
        ((Calendar*)this)->updateTime(status);

    /* Test for buffer overflows */
    if(U_FAILURE(status)) {
        return 0.0;
    }
    return fTime;
}